

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void destroyRootPage(Parse *pParse,int iTable,int iDb)

{
  byte bVar1;
  undefined8 in_RAX;
  Vdbe *p;
  Parse *pPVar2;
  uint p2;
  undefined4 uVar3;
  
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  p = pParse->pVdbe;
  if (p == (Vdbe *)0x0) {
    p = allocVdbe(pParse);
  }
  if (pParse->nTempReg == '\0') {
    p2 = pParse->nMem + 1;
    pParse->nMem = p2;
  }
  else {
    bVar1 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar1;
    p2 = pParse->aTempReg[bVar1];
  }
  sqlite3VdbeAddOp3(p,0x82,iTable,p2,iDb);
  pPVar2 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar2 = pParse;
  }
  pPVar2->mayAbort = '\x01';
  sqlite3NestedParse(pParse,"UPDATE %Q.%s SET rootpage=%d WHERE #%d AND rootpage=#%d",
                     pParse->db->aDb[iDb].zDbSName,"sqlite_master",iTable,(ulong)p2,
                     CONCAT44(uVar3,p2));
  sqlite3ReleaseTempReg(pParse,p2);
  return;
}

Assistant:

static void destroyRootPage(Parse *pParse, int iTable, int iDb){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int r1 = sqlite3GetTempReg(pParse);
  assert( iTable>1 );
  sqlite3VdbeAddOp3(v, OP_Destroy, iTable, r1, iDb);
  sqlite3MayAbort(pParse);
#ifndef SQLITE_OMIT_AUTOVACUUM
  /* OP_Destroy stores an in integer r1. If this integer
  ** is non-zero, then it is the root page number of a table moved to
  ** location iTable. The following code modifies the sqlite_master table to
  ** reflect this.
  **
  ** The "#NNN" in the SQL is a special constant that means whatever value
  ** is in register NNN.  See grammar rules associated with the TK_REGISTER
  ** token for additional information.
  */
  sqlite3NestedParse(pParse, 
     "UPDATE %Q.%s SET rootpage=%d WHERE #%d AND rootpage=#%d",
     pParse->db->aDb[iDb].zDbSName, MASTER_NAME, iTable, r1, r1);
#endif
  sqlite3ReleaseTempReg(pParse, r1);
}